

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2Chan::set(V2Chan *this,syVChan *para)

{
  syVChan *para_local;
  V2Chan *this_local;
  
  this->aarcv = para->auxarcv / 128.0;
  this->abrcv = para->auxbrcv / 128.0;
  this->aasnd = (para->auxasnd / 128.0) * 0.6;
  this->absnd = (para->auxbsnd / 128.0) * 0.6;
  this->chgain = (para->chanvol / 128.0) * 0.6;
  this->a1gain = this->chgain * 0.6 * (para->aux1 / 128.0);
  this->a2gain = this->chgain * 0.6 * (para->aux2 / 128.0);
  this->fxr = (int)para->fxroute;
  V2Dist::set(&this->dist,&para->dist);
  V2ModDel::set(&this->chorus,&para->chorus);
  V2Comp::set(&this->comp,&para->comp);
  V2Boost::set(&this->boost,&para->boost);
  return;
}

Assistant:

void set(const syVChan *para)
    {
        aarcv = para->auxarcv / 128.0f;
        abrcv = para->auxbrcv / 128.0f;
        aasnd = fcgain * (para->auxasnd / 128.0f);
        absnd = fcgain * (para->auxbsnd / 128.0f);
        chgain = fcgain * (para->chanvol / 128.0f);
        a1gain = chgain * fcgainh * (para->aux1 / 128.0f);
        a2gain = chgain * fcgainh * (para->aux2 / 128.0f);
        fxr = (int)para->fxroute;
        dist.set(&para->dist);
        chorus.set(&para->chorus);
        comp.set(&para->comp);
        boost.set(&para->boost);
    }